

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hh
# Opt level: O3

void __thiscall SatLookAngles::SatLookAngles(SatLookAngles *this,double lat,double lon,double alt)

{
  long lVar1;
  
  (this->_sats).
  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_sats).
  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_sats).
  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Observer::Observer(&this->_me,lat,lon,alt);
  lVar1 = std::chrono::_V2::system_clock::now();
  (this->_time).m_encoded = lVar1 / 1000 + 0xdcbffeff2bc000;
  return;
}

Assistant:

SatLookAngles(double lat, double lon, double alt)
      : _me(lat, lon, alt), _time(DateTime::Now(true)) {}